

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall
QListWidgetPrivate::emitCurrentItemChanged
          (QListWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QObject *pQVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  QPersistentModelIndex persistentCurrent;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QPersistentModelIndex local_68;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_68.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_68,current);
  lVar5 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  iVar3 = QPersistentModelIndex::row();
  if ((ulong)(long)iVar3 < *(ulong *)(lVar5 + 0x20)) {
    pQVar6 = *(QArrayData **)(*(long *)(lVar5 + 0x18) + (long)iVar3 * 8);
  }
  else {
    pQVar6 = (QArrayData *)0x0;
  }
  lVar5 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  if ((ulong)(long)previous->r < *(ulong *)(lVar5 + 0x20)) {
    local_60 = *(undefined8 *)(*(long *)(lVar5 + 0x18) + (long)previous->r * 8);
  }
  else {
    local_60 = 0;
  }
  local_58._16_8_ = &local_60;
  local_58.shared = (PrivateShared *)0x0;
  local_88 = pQVar6;
  local_58._8_8_ = &local_88;
  QMetaObject::activate(pQVar1,&QListWidget::staticMetaObject,6,&local_58.shared);
  cVar2 = QPersistentModelIndex::isValid();
  if ((cVar2 == '\0') || (pQVar6 == (QArrayData *)0x0)) {
    local_88 = (QArrayData *)0x0;
    uStack_80 = 0;
    local_78 = 0;
  }
  else {
    (**(code **)(*(long *)pQVar6 + 0x18))(&local_58,pQVar6,0);
    ::QVariant::toString();
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = &local_88;
  QMetaObject::activate(pQVar1,&QListWidget::staticMetaObject,7,&local_58.shared);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  uVar4 = QPersistentModelIndex::row();
  local_88 = (QArrayData *)CONCAT44(local_88._4_4_,uVar4);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = &local_88;
  QMetaObject::activate(pQVar1,&QListWidget::staticMetaObject,8,&local_58.shared);
  QPersistentModelIndex::~QPersistentModelIndex(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                const QModelIndex &previous)
{
    Q_Q(QListWidget);
    QPersistentModelIndex persistentCurrent = current;
    QListWidgetItem *currentItem = listModel()->at(persistentCurrent.row());
    emit q->currentItemChanged(currentItem, listModel()->at(previous.row()));

    //persistentCurrent is invalid if something changed the model in response
    //to the currentItemChanged signal emission and the item was removed
    if (!persistentCurrent.isValid()) {
        currentItem = nullptr;
    }

    emit q->currentTextChanged(currentItem ? currentItem->text() : QString());
    emit q->currentRowChanged(persistentCurrent.row());
}